

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_f89de::CreateCompareNotEqual
                    (VmModule *module,SynBase *source,VmValue *lhs,VmValue *rhs)

{
  VmValueType VVar1;
  uint uVar2;
  VmInstruction *pVVar3;
  VmValue *unaff_retaddr;
  
  VVar1 = (lhs->type).type;
  uVar2 = (lhs->type).size;
  if (uVar2 != 4 || VVar1 != VM_TYPE_INT) {
    if ((VVar1 != VM_TYPE_POINTER) && ((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || uVar2 != 8)) {
      __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long || lhs->type.type == VM_TYPE_POINTER"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x284,
                    "VmValue *(anonymous namespace)::CreateCompareNotEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                   );
    }
  }
  if ((VVar1 == (rhs->type).type) && (uVar2 == (rhs->type).size)) {
    pVVar3 = CreateInstruction((anon_unknown_dwarf_f89de *)module,(VmModule *)source,
                               (SynBase *)0x400000001,(VmType)(ZEXT816(0x2d) << 0x40),
                               (VmInstructionType)lhs,rhs,unaff_retaddr);
    return &pVVar3->super_VmValue;
  }
  __assert_fail("lhs->type == rhs->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x285,
                "VmValue *(anonymous namespace)::CreateCompareNotEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
               );
}

Assistant:

VmValue* CreateCompareNotEqual(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long || lhs->type.type == VM_TYPE_POINTER);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, VmType::Int, VM_INST_NOT_EQUAL, lhs, rhs);
	}